

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<capnp::compiler::ParsedFile::Reader&>
          (String *__return_storage_ptr__,kj *this,Reader *params)

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringTree local_48;
  
  capnp::_::structString
            (&local_48,*(StructReader *)this,
             (RawBrandedSchema *)(capnp::schemas::s_84e4f3f5a807605c + 0x48));
  _::concat<kj::StringTree>(__return_storage_ptr__,&local_48);
  sVar2 = local_48.branches.size_;
  pBVar3 = local_48.branches.ptr;
  if (local_48.branches.ptr != (Branch *)0x0) {
    local_48.branches.ptr = (Branch *)0x0;
    local_48.branches.size_ = 0;
    (*(code *)**(undefined8 **)local_48.branches.disposer)
              (local_48.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_48.text.content.size_;
  pcVar1 = local_48.text.content.ptr;
  if (local_48.text.content.ptr != (char *)0x0) {
    local_48.text.content.ptr = (char *)0x0;
    local_48.text.content.size_ = 0;
    (*(code *)**(undefined8 **)local_48.text.content.disposer)
              (local_48.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}